

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::testScanLineImage(Box2i *dataWindow,string *fileName)

{
  ostream *poVar1;
  int *in_RDI;
  DeepImage img2;
  Rand48 random;
  DeepImage img1;
  Box2i *in_stack_fffffffffffffe18;
  Image *in_stack_fffffffffffffe20;
  DeepImage *img;
  allocator<char> *in_stack_fffffffffffffe50;
  allocator<char> *__a;
  allocator<char> *__s;
  char *pcVar2;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  PixelType in_stack_fffffffffffffe84;
  string *in_stack_fffffffffffffe88;
  Image *in_stack_fffffffffffffe90;
  allocator<char> local_121;
  string local_120 [39];
  undefined1 local_f9 [40];
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [160];
  int *local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"scan lines, data window = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  pcVar2 = ", ";
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[1]);
  poVar1 = std::operator<<(poVar1,") - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[2]);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[3]);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::DeepImage::DeepImage((DeepImage *)in_stack_fffffffffffffe50);
  Imf_2_5::Image::resize(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  __s = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,in_stack_fffffffffffffe50);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  __a = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  img = (DeepImage *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffffe20,(unsigned_long)in_stack_fffffffffffffe18);
  poVar1 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  fillChannels((Rand48 *)__a,img);
  poVar1 = std::operator<<((ostream *)&std::cout,"    saving file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::saveDeepScanLineImage
            ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (DeepImage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Imf_2_5::DeepImage::DeepImage((DeepImage *)__a);
  poVar1 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::loadDeepImage
            ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (DeepImage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  poVar1 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  verifyImagesAreEqual
            ((DeepImage *)in_stack_fffffffffffffe90,(DeepImage *)in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x11d80b);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x11d818);
  return;
}

Assistant:

void
testScanLineImage
    (const Box2i &dataWindow,
     const string &fileName)
{
    cout << "scan lines, data window = "
            "(" << dataWindow.min.x << ", " << dataWindow.min.y << ") - "
            "(" << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    FlatImage img1;
    img1.resize (dataWindow);

    img1.insertChannel ("H11", HALF, 1, 1, false);
    img1.insertChannel ("H22", HALF, 2, 2, true);
    img1.insertChannel ("H12", HALF, 1, 2, true);
    img1.insertChannel ("H21", HALF, 2, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveFlatScanLineImage (fileName, img1);
    
    FlatImage img2;

    cout << "    loading file" << endl;
    loadFlatImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str());
}